

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim.c
# Opt level: O3

Abc_Cex_t *
Gia_ManGenerateCounter(Gia_Man_t *pAig,int iFrame,int iOut,int nWords,int iPat,Vec_Int_t *vCis2Ids)

{
  uint uVar1;
  Abc_Cex_t *pAVar2;
  void *__ptr;
  ulong uVar3;
  Vec_Int_t *pVVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  bool bVar9;
  int local_64;
  
  pAVar2 = Abc_CexAlloc(pAig->nRegs,pAig->vCis->nSize - pAig->nRegs,iFrame + 1);
  pAVar2->iFrame = iFrame;
  pAVar2->iPo = iOut;
  local_64 = pAVar2->nRegs;
  __ptr = malloc((long)nWords << 2);
  if (-1 < iFrame) {
    uVar3 = (ulong)(uint)pAig->nRegs;
    pVVar4 = pAig->vCis;
    iVar6 = 0;
    do {
      if ((int)uVar3 < pVVar4->nSize) {
        lVar5 = 0;
        do {
          if (vCis2Ids->nSize <= lVar5) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          iVar8 = vCis2Ids->pArray[lVar5];
          if (iVar8 < pAVar2->nPis) {
            lVar7 = (ulong)(uint)nWords + 1;
            if (0 < nWords) {
              do {
                uVar1 = Gia_ManRandom(0);
                *(uint *)((long)__ptr + lVar7 * 4 + -8) = uVar1;
                lVar7 = lVar7 + -1;
              } while (1 < lVar7);
            }
            if ((*(uint *)((long)__ptr + (long)(iPat >> 5) * 4) & 1 << ((byte)iPat & 0x1f)) != 0) {
              iVar8 = iVar8 + local_64;
              (&pAVar2[1].iPo)[iVar8 >> 5] =
                   (&pAVar2[1].iPo)[iVar8 >> 5] | 1 << ((byte)iVar8 & 0x1f);
            }
          }
          lVar5 = lVar5 + 1;
          uVar3 = (ulong)pAig->nRegs;
          pVVar4 = pAig->vCis;
        } while (lVar5 < (long)((long)pVVar4->nSize - uVar3));
      }
      local_64 = local_64 + pAVar2->nPis;
      bVar9 = iVar6 != iFrame;
      iVar6 = iVar6 + 1;
    } while (bVar9);
  }
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
  return pAVar2;
}

Assistant:

Abc_Cex_t * Gia_ManGenerateCounter( Gia_Man_t * pAig, int iFrame, int iOut, int nWords, int iPat, Vec_Int_t * vCis2Ids )
{
    Abc_Cex_t * p;
    unsigned * pData;
    int f, i, w, iPioId, Counter;
    p = Abc_CexAlloc( Gia_ManRegNum(pAig), Gia_ManPiNum(pAig), iFrame+1 );
    p->iFrame = iFrame;
    p->iPo    = iOut;
    // fill in the binary data
    Counter = p->nRegs;
    pData = ABC_ALLOC( unsigned, nWords );
    for ( f = 0; f <= iFrame; f++, Counter += p->nPis )
    for ( i = 0; i < Gia_ManPiNum(pAig); i++ )
    {
        iPioId = Vec_IntEntry( vCis2Ids, i );
        if ( iPioId >= p->nPis )
            continue;
        for ( w = nWords-1; w >= 0; w-- )
            pData[w] = Gia_ManRandom( 0 );
        if ( Abc_InfoHasBit( pData, iPat ) )
            Abc_InfoSetBit( p->pData, Counter + iPioId );
    }
    ABC_FREE( pData );
    return p;
}